

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O3

ssize_t __thiscall phpconvert::ZendParser::write(ZendParser *this,int __fd,void *__buf,size_t __n)

{
  DirectoryReader *pDVar1;
  pointer pPVar2;
  long *plVar3;
  ssize_t extraout_RAX;
  long *plVar4;
  size_type *psVar5;
  PreparedType *type;
  pointer type_00;
  undefined4 in_register_00000034;
  pointer pFVar6;
  File fileCopy;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  string local_208;
  int *local_1e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1e0;
  string local_1d8;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  bool local_118;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  vStack_90;
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_1e0 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_register_00000034,__fd);
  *(undefined4 *)__buf = 0;
  local_198._0_8_ = local_198 + 0x10;
  local_198._8_8_ = 0;
  local_198[0x10] = '\0';
  local_178._M_p = (pointer)&local_168;
  local_170 = 0;
  local_168._M_local_buf[0] = '\0';
  local_158._M_p = (pointer)&local_148;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_138._M_p = (pointer)&local_128;
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_110._M_p = (pointer)&local_100;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_78.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_90.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (PreparedType *)0x0;
  vStack_90.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_90.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_start = (PreparedType *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pFVar6 = (this->results->
           super__Vector_base<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = (int *)__buf;
  if (pFVar6 != (this->results->
                super__Vector_base<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::_M_assign((string *)local_198);
      std::__cxx11::string::_M_assign((string *)&local_178);
      std::__cxx11::string::_M_assign((string *)&local_158);
      std::__cxx11::string::_M_assign((string *)&local_138);
      local_118 = pFVar6->isValid;
      std::__cxx11::string::_M_assign((string *)&local_110);
      std::__cxx11::string::_M_assign((string *)&local_f0);
      std::__cxx11::string::_M_assign((string *)&local_d0);
      local_b0 = pFVar6->mainTypes;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_a8,&pFVar6->types);
      std::
      vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
      ::operator=(&vStack_90,&pFVar6->prepTypes);
      std::
      vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
      ::operator=(&local_78,&pFVar6->prepTypesMain);
      pDVar1 = this->reader;
      DirectoryReader::getDirectorySeparator_abi_cxx11_();
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_228,0,(char *)0x0,
                                  (ulong)(this->super_BaseParser).outputDir._M_dataplus._M_p);
      local_248 = &local_238;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_238 = *plVar4;
        lStack_230 = plVar3[3];
      }
      else {
        local_238 = *plVar4;
        local_248 = (long *)*plVar3;
      }
      local_240 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_248,(ulong)(pFVar6->rootPath)._M_dataplus._M_p);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_1d8.field_2._M_allocated_capacity = *psVar5;
        local_1d8.field_2._8_8_ = plVar3[3];
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *psVar5;
        local_1d8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_1d8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      DirectoryReader::createDir(pDVar1,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228);
      }
      replaceTypesBuiltIn(this,(File *)local_198);
      replaceTypesGlobal(this,(File *)local_198);
      addNamespace(this,(File *)local_198);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&local_60,local_1e0);
      addUsages(this,(File *)local_198,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
      pPVar2 = vStack_90.
               super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (type_00 = vStack_90.
                     super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                     ._M_impl.super__Vector_impl_data._M_start; type_00 != pPVar2;
          type_00 = type_00 + 1) {
        replaceType(this,type_00,(File *)local_198);
      }
      pDVar1 = this->reader;
      DirectoryReader::getDirectorySeparator_abi_cxx11_();
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_1b8,0,(char *)0x0,
                                  (ulong)(this->super_BaseParser).outputDir._M_dataplus._M_p);
      local_228 = &local_218;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_218 = *plVar4;
        lStack_210 = plVar3[3];
      }
      else {
        local_218 = *plVar4;
        local_228 = (long *)*plVar3;
      }
      local_220 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_158._M_p);
      local_248 = &local_238;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_238 = *plVar4;
        lStack_230 = plVar3[3];
      }
      else {
        local_238 = *plVar4;
        local_248 = (long *)*plVar3;
      }
      local_240 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_248,local_198._0_8_);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_208.field_2._M_allocated_capacity = *psVar5;
        local_208.field_2._8_8_ = plVar3[3];
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar5;
        local_208._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_208._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      DirectoryReader::writeTextFile(pDVar1,&local_208,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228);
      }
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0]);
      }
      *local_1e8 = *local_1e8 + 1;
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 != (this->results->
                       super__Vector_base<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  BaseParser::File::~File((File *)local_198);
  return extraout_RAX;
}

Assistant:

void ZendParser::write(const set<string> &tmpSet, int &generated) {
        generated = 0;
        File fileCopy;
        vector<ZendParser::File>::iterator file;
        for (file = results->begin(); file != results->end(); ++file) {
//            if (file->name.compare("View.php") != 0) {
//                if (file->name.compare("Interface.php") != 0) {
//                    if (file->name.compare("Exception.php") != 0) {
//                        continue;
//                    }
//                }
//            }
//            else if (file->name.compare("Interface.php") != 0) {
//            }
//            else if (file->name.compare("Exception.php") != 0) {
//            }
//            else {
//                continue;
//            }

//		if (file->name.compare("Role.php") != 0) {
//			continue;
//		}
//        if (file->name.compare("Registry.php")) {
//            continue;
//        }
//		if (file->name.compare("Exception.php")!=0) {
//			continue;
//		}
//		if (file->name.compare("Initializer.php")) {
//			continue;
//		}
//		if (file->name.compare("Select.php")) {
//			continue;
//		}
            fileCopy = *file;
            getReader()->createDir(outputDir + DirectoryReader::getDirectorySeparator() + file->rootPath);
            replaceTypesBuiltIn(fileCopy); //@todo problem here
            replaceTypesGlobal(fileCopy);
//		cout << fileCopy.mainType << "\n";
//            if (fileCopy.mainType.length() > 0) {

                addNamespace(fileCopy);
                addUsages(fileCopy, tmpSet);
                replaceTypes(fileCopy);
//            }


            getReader()->writeTextFile(
                    outputDir + DirectoryReader::getDirectorySeparator() + fileCopy.rootPath + fileCopy.name,
                    fileCopy.content);
            generated++;
        }
    }